

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::anon_unknown_24::SourceLocationCommentPrinter::FormatComment
          (string *__return_storage_ptr__,SourceLocationCommentPrinter *this,string *comment_text)

{
  string_view value;
  bool bVar1;
  reference_conflict pvVar2;
  char in_R8B;
  ConvertibleToStringView text;
  Arg local_168;
  Arg local_138;
  string_view local_108;
  size_t sStack_f8;
  string_view line;
  undefined1 local_e0 [8];
  const_iterator __end3;
  const_iterator __begin3;
  size_t local_78;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_70;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_58;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *__range3;
  undefined1 local_40 [8];
  string stripped_comment;
  string *comment_text_local;
  SourceLocationCommentPrinter *this_local;
  string *output;
  
  stripped_comment.field_2._8_8_ = comment_text;
  std::__cxx11::string::string((string *)local_40,(string *)comment_text);
  absl::lts_20250127::StripAsciiWhitespace((Nonnull<std::string_*>)local_40);
  __range3._3_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
            ((ConvertibleToStringView *)&__begin3.delimiter_,(string *)local_40);
  text.value_._M_str = (char *)0xa;
  text.value_._M_len = local_78;
  absl::lts_20250127::StrSplit<char>(&local_70,(lts_20250127 *)__begin3._40_8_,text,in_R8B);
  local_58 = &local_70;
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::begin((const_iterator *)&__end3.delimiter_,local_58);
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::end((const_iterator *)local_e0,local_58);
  while (bVar1 = absl::lts_20250127::strings_internal::operator!=
                           ((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)&__end3.delimiter_,
                            (SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)local_e0), bVar1) {
    pvVar2 = absl::lts_20250127::strings_internal::
             SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::operator*((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)&__end3.delimiter_);
    sStack_f8 = pvVar2->_M_len;
    line._M_len = (size_t)pvVar2->_M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_108,"$0// $1\n")
    ;
    absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
              (&local_138,&this->prefix_);
    value._M_str = (char *)line._M_len;
    value._M_len = sStack_f8;
    absl::lts_20250127::substitute_internal::Arg::Arg(&local_168,value);
    absl::lts_20250127::SubstituteAndAppend(__return_storage_ptr__,local_108,&local_138,&local_168);
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)&__end3.delimiter_);
  }
  __range3._3_1_ = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatComment(const std::string& comment_text) {
    std::string stripped_comment = comment_text;
    absl::StripAsciiWhitespace(&stripped_comment);
    std::string output;
    for (absl::string_view line : absl::StrSplit(stripped_comment, '\n')) {
      absl::SubstituteAndAppend(&output, "$0// $1\n", prefix_, line);
    }
    return output;
  }